

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHandlerCommand.cxx
# Opt level: O0

bool __thiscall cmCTestHandlerCommand::CheckArgumentValue(cmCTestHandlerCommand *this,string *arg)

{
  uint uVar1;
  cmMakefile *this_00;
  cmCTest *this_01;
  reference ppcVar2;
  ostream *poVar3;
  value_type pcVar4;
  char *msg;
  string local_368 [32];
  ostringstream local_348 [8];
  ostringstream cmCTestLog_msg;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  uint k;
  string *arg_local;
  cmCTestHandlerCommand *this_local;
  
  if (this->ArgumentDoing == 2) {
    this->ArgumentDoing = 0;
    uVar1 = this->ArgumentIndex;
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&this->Values,(ulong)uVar1);
    if (*ppcVar2 == (value_type)0x0) {
      pcVar4 = (value_type)std::__cxx11::string::c_str();
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->Values,(ulong)uVar1);
      *ppcVar2 = pcVar4;
      std::__cxx11::ostringstream::ostringstream(local_348);
      poVar3 = std::operator<<((ostream *)local_348,"Set ");
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->Arguments,(ulong)uVar1);
      poVar3 = std::operator<<(poVar3,*ppcVar2);
      poVar3 = std::operator<<(poVar3," to ");
      poVar3 = std::operator<<(poVar3,(string *)arg);
      std::operator<<(poVar3,"\n");
      this_01 = (this->super_cmCTestCommand).CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_01,0,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestHandlerCommand.cxx"
                   ,0x124,msg,false);
      std::__cxx11::string::~string(local_368);
      std::__cxx11::ostringstream::~ostringstream(local_348);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1a0);
      poVar3 = std::operator<<((ostream *)local_1a0,"Called with more than one value for ");
      ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&this->Arguments,(ulong)uVar1);
      std::operator<<(poVar3,*ppcVar2);
      this_00 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      this->ArgumentDoing = 1;
      this_local._7_1_ = true;
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestHandlerCommand::CheckArgumentValue(std::string const& arg)
{
  if (this->ArgumentDoing == ArgumentDoingKeyword) {
    this->ArgumentDoing = ArgumentDoingNone;
    unsigned int k = this->ArgumentIndex;
    if (this->Values[k]) {
      std::ostringstream e;
      e << "Called with more than one value for " << this->Arguments[k];
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      this->ArgumentDoing = ArgumentDoingError;
      return true;
    }
    this->Values[k] = arg.c_str();
    cmCTestLog(this->CTest, DEBUG, "Set " << this->Arguments[k] << " to "
                                          << arg << "\n");
    return true;
  }
  return false;
}